

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_protocol_send_acknowledgements(ENetHost *host,ENetPeer *peer)

{
  _ENetListNode *p_Var1;
  uint16_t uVar2;
  _ENetListNode *p_Stack_38;
  uint16_t reliableSequenceNumber;
  ENetListIterator currentAcknowledgement;
  ENetAcknowledgement *acknowledgement;
  ENetBuffer *buffer;
  ENetProtocol *command;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  buffer = (ENetBuffer *)(host->commands + host->commandCount);
  acknowledgement = (ENetAcknowledgement *)(host->buffers + host->bufferCount);
  p_Stack_38 = (peer->acknowledgements).sentinel.next;
  do {
    if (p_Stack_38 == &(peer->acknowledgements).sentinel) {
LAB_00108879:
      host->commandCount = ((long)buffer - (long)host->commands) / 0x30;
      host->bufferCount = (long)acknowledgement - (long)host->buffers >> 4;
      return;
    }
    if (((&host->field_0x68c <= buffer) || (&host->bufferCount <= acknowledgement)) ||
       ((ulong)peer->mtu - host->packetSize < 8)) {
      host->continueSending = 1;
      goto LAB_00108879;
    }
    p_Var1 = p_Stack_38->next;
    (acknowledgement->acknowledgementList).next = (_ENetListNode *)buffer;
    (acknowledgement->acknowledgementList).previous = (_ENetListNode *)0x8;
    host->packetSize =
         (long)&((acknowledgement->acknowledgementList).previous)->next + host->packetSize;
    uVar2 = htons(*(uint16_t *)((long)&p_Stack_38[1].next + 6));
    *(undefined1 *)&buffer->data = 1;
    *(undefined1 *)((long)&buffer->data + 1) = *(undefined1 *)((long)&p_Stack_38[1].next + 5);
    *(uint16_t *)((long)&buffer->data + 2) = uVar2;
    *(uint16_t *)((long)&buffer->data + 4) = uVar2;
    uVar2 = htons((uint16_t)*(undefined4 *)&p_Stack_38[1].next);
    *(uint16_t *)((long)&buffer->data + 6) = uVar2;
    if (((ulong)p_Stack_38[1].next & 0xf00000000) == 0x400000000) {
      enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
    }
    enet_list_remove(p_Stack_38);
    enet_free(p_Stack_38);
    buffer = buffer + 3;
    acknowledgement = (ENetAcknowledgement *)&acknowledgement->sentTime;
    p_Stack_38 = p_Var1;
  } while( true );
}

Assistant:

static void enet_protocol_send_acknowledgements(ENetHost* host, ENetPeer* peer) {
	ENetProtocol* command = &host->commands[host->commandCount];
	ENetBuffer* buffer = &host->buffers[host->bufferCount];
	ENetAcknowledgement* acknowledgement;
	ENetListIterator currentAcknowledgement;
	uint16_t reliableSequenceNumber;
	currentAcknowledgement = enet_list_begin(&peer->acknowledgements);

	while (currentAcknowledgement != enet_list_end(&peer->acknowledgements)) {
		if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] || buffer >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] || peer->mtu - host->packetSize < sizeof(ENetProtocolAcknowledge)) {
			host->continueSending = 1;

			break;
		}

		acknowledgement = (ENetAcknowledgement*)currentAcknowledgement;
		currentAcknowledgement = enet_list_next(currentAcknowledgement);
		buffer->data = command;
		buffer->dataLength = sizeof(ENetProtocolAcknowledge);
		host->packetSize += buffer->dataLength;
		reliableSequenceNumber = ENET_HOST_TO_NET_16(acknowledgement->command.header.reliableSequenceNumber);
		command->header.command = ENET_PROTOCOL_COMMAND_ACKNOWLEDGE;
		command->header.channelID = acknowledgement->command.header.channelID;
		command->header.reliableSequenceNumber = reliableSequenceNumber;
		command->acknowledge.receivedReliableSequenceNumber = reliableSequenceNumber;
		command->acknowledge.receivedSentTime = ENET_HOST_TO_NET_16(acknowledgement->sentTime);

		if ((acknowledgement->command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_DISCONNECT)
			enet_protocol_dispatch_state(host, peer, ENET_PEER_STATE_ZOMBIE);

		enet_list_remove(&acknowledgement->acknowledgementList);
		enet_free(acknowledgement);

		++command;
		++buffer;
	}

	host->commandCount = command - host->commands;
	host->bufferCount = buffer - host->buffers;
}